

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_device.c
# Opt level: O1

int internal_device_stop(AMQP_DEVICE_INSTANCE_conflict *instance)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  ON_DEVICE_STATE_CHANGED p_Var3;
  DEVICE_STATE DVar4;
  DEVICE_STATE previous_state;
  DEVICE_STATE DVar5;
  void *pvVar6;
  
  if (((instance->msgr_state & ~TELEMETRY_MESSENGER_STATE_STARTED) ==
       TELEMETRY_MESSENGER_STATE_STOPPING) ||
     (iVar1 = telemetry_messenger_stop(instance->messenger_handle), iVar1 == 0)) {
    if (((instance->twin_msgr_state & ~TWIN_MESSENGER_STATE_STARTED) ==
         TWIN_MESSENGER_STATE_STOPPING) ||
       (iVar1 = twin_messenger_stop(instance->twin_messenger_handle), iVar1 == 0)) {
      if (((instance->config->authentication_mode == DEVICE_AUTH_MODE_CBS) &&
          (instance->auth_state != AUTHENTICATION_STATE_STOPPED)) &&
         (iVar1 = authentication_stop(instance->authentication_handle), iVar1 != 0)) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                    ,"internal_device_stop",0x34a,1,
                    "Failed stopping device \'%s\' (authentication_stop failed)",
                    instance->config->device_id);
        }
        DVar5 = instance->state;
        iVar1 = 0x34c;
        if (DVar5 == DEVICE_STATE_ERROR_AUTH) {
          return 0x34c;
        }
        instance->state = DEVICE_STATE_ERROR_AUTH;
        p_Var3 = instance->config->on_state_changed_callback;
        if (p_Var3 == (ON_DEVICE_STATE_CHANGED)0x0) {
          return 0x34c;
        }
        pvVar6 = instance->config->on_state_changed_context;
        DVar4 = DEVICE_STATE_ERROR_AUTH;
      }
      else {
        DVar5 = instance->state;
        if (DVar5 == DEVICE_STATE_STOPPED) {
          return 0;
        }
        instance->state = DEVICE_STATE_STOPPED;
        p_Var3 = instance->config->on_state_changed_callback;
        if (p_Var3 == (ON_DEVICE_STATE_CHANGED)0x0) {
          return 0;
        }
        pvVar6 = instance->config->on_state_changed_context;
        iVar1 = 0;
        DVar4 = DEVICE_STATE_STOPPED;
      }
      goto LAB_00130ff0;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                ,"internal_device_stop",0x342,1,
                "Failed stopping device \'%s\' (twin_messenger_stop failed)",
                instance->config->device_id);
    }
    DVar5 = instance->state;
    iVar1 = 0x344;
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                ,"internal_device_stop",0x33a,1,
                "Failed stopping device \'%s\' (telemetry_messenger_stop failed)",
                instance->config->device_id);
    }
    DVar5 = instance->state;
    iVar1 = 0x33c;
  }
  if (DVar5 == DEVICE_STATE_ERROR_MSG) {
    return iVar1;
  }
  instance->state = DEVICE_STATE_ERROR_MSG;
  p_Var3 = instance->config->on_state_changed_callback;
  if (p_Var3 == (ON_DEVICE_STATE_CHANGED)0x0) {
    return iVar1;
  }
  pvVar6 = instance->config->on_state_changed_context;
  DVar4 = DEVICE_STATE_ERROR_MSG;
LAB_00130ff0:
  (*p_Var3)(pvVar6,DVar5,DVar4);
  return iVar1;
}

Assistant:

static int internal_device_stop(AMQP_DEVICE_INSTANCE* instance)
{
    int result;

    if (instance->msgr_state != TELEMETRY_MESSENGER_STATE_STOPPED &&
        instance->msgr_state != TELEMETRY_MESSENGER_STATE_STOPPING &&
        telemetry_messenger_stop(instance->messenger_handle) != RESULT_OK)
    {
        LogError("Failed stopping device '%s' (telemetry_messenger_stop failed)", instance->config->device_id);
        update_state(instance, DEVICE_STATE_ERROR_MSG);
        result = MU_FAILURE;
    }
    else if (instance->twin_msgr_state != TWIN_MESSENGER_STATE_STOPPED &&
        instance->twin_msgr_state != TWIN_MESSENGER_STATE_STOPPING &&
        twin_messenger_stop(instance->twin_messenger_handle) != RESULT_OK)
    {
        LogError("Failed stopping device '%s' (twin_messenger_stop failed)", instance->config->device_id);
        update_state(instance, DEVICE_STATE_ERROR_MSG);
        result = MU_FAILURE;
    }
    else if (instance->config->authentication_mode == DEVICE_AUTH_MODE_CBS &&
        instance->auth_state != AUTHENTICATION_STATE_STOPPED &&
        authentication_stop(instance->authentication_handle) != RESULT_OK)
    {
        LogError("Failed stopping device '%s' (authentication_stop failed)", instance->config->device_id);
        update_state(instance, DEVICE_STATE_ERROR_AUTH);
        result = MU_FAILURE;
    }
    else
    {
        update_state(instance, DEVICE_STATE_STOPPED);
        result = RESULT_OK;
    }

    return result;
}